

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueSamplerCase::test
          (UniformValueSamplerCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLint location;
  GLint in_R8D;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  ShaderProgram program;
  ProgramSources local_e8;
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"void main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",&local_1f9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "uniform highp sampler2D uniformSampler;\nvoid main (void)\n{\n\tgl_FragColor = vec4(texture2D(uniformSampler, vec2(0.0, 0.0)).x);\n}\n"
             ,&local_1fa);
  glu::makeVtxFragSources(&local_e8,&local_1d8,&local_1f8);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&program);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    location = glu::CallLogWrapper::glGetUniformLocation
                         (this_00,program.m_program.m_program,"uniformSampler");
    glu::CallLogWrapper::glUniform1i(this_00,location,1);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,location,in_R8D);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n";
		static const char* testFragSource =
			"uniform highp sampler2D uniformSampler;\n"

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(texture2D(uniformSampler, vec2(0.0, 0.0)).x);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program.getProgram(), "uniformSampler");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}